

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

int __thiscall AddrManImpl::CheckAddrman(AddrManImpl *this)

{
  key_type *__k;
  uint256 *this_00;
  long lVar1;
  pointer plVar2;
  string prefix;
  string end_msg;
  bool bVar3;
  uint uVar4;
  mapped_type *pmVar5;
  uint *puVar6;
  const_iterator cVar7;
  size_type sVar8;
  const_iterator cVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  __node_base *p_Var13;
  int i_1;
  unsigned_long *in_R9;
  int i;
  ulong uVar14;
  nid_type (*panVar15) [64];
  int n_1;
  __node_base *p_Var16;
  long lVar17;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  int iVar18;
  undefined8 in_stack_fffffffffffffe60;
  int *fmt;
  nid_type (*panVar19) [64];
  undefined8 in_stack_fffffffffffffe68;
  _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  undefined4 in_stack_fffffffffffffe70;
  key_type in_stack_fffffffffffffe74;
  nid_type n;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  local_counts;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  mapNew;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> setTried;
  string local_d8;
  string local_b8 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> logging_timer2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"CheckAddrman",(allocator<char> *)&mapNew);
  fmt = &this->nNew;
  setTried._M_h._M_buckets =
       (__buckets_ptr)
       ((long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3);
  tinyformat::format<int,int,unsigned_long>
            (&local_d8,(tinyformat *)"new %i, tried %i, total %u",(char *)fmt,&this->nTried,
             (int *)&setTried,in_R9);
  prefix._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffe5c;
  prefix._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe58;
  prefix._M_string_length = in_stack_fffffffffffffe60;
  prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffe68;
  prefix.field_2._8_4_ = in_stack_fffffffffffffe70;
  prefix.field_2._12_4_ = in_stack_fffffffffffffe74;
  end_msg._M_string_length = (size_type)local_counts._M_h._M_buckets;
  end_msg._M_dataplus._M_p = (pointer)n;
  end_msg.field_2._M_allocated_capacity = local_counts._M_h._M_bucket_count;
  end_msg.field_2._8_8_ = local_counts._M_h._M_before_begin._M_nxt;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::Timer
            (&logging_timer2,prefix,end_msg,(LogFlags)local_b8,SUB81(&local_d8,0));
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string(local_b8);
  setTried._M_h._M_buckets = &setTried._M_h._M_single_bucket;
  setTried._M_h._M_bucket_count = 1;
  setTried._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  setTried._M_h._M_element_count = 0;
  setTried._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  setTried._M_h._M_rehash_policy._M_next_resize = 0;
  setTried._M_h._M_single_bucket = (__node_base_ptr)0x0;
  mapNew._M_h._M_buckets = &mapNew._M_h._M_single_bucket;
  mapNew._M_h._M_bucket_count = 1;
  mapNew._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mapNew._M_h._M_element_count = 0;
  mapNew._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mapNew._M_h._M_rehash_policy._M_next_resize = 0;
  mapNew._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_counts._M_h._M_buckets = &local_counts._M_h._M_single_bucket;
  local_counts._M_h._M_bucket_count = 1;
  local_counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_counts._M_h._M_element_count = 0;
  local_counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_counts._M_h._M_rehash_policy._M_next_resize = 0;
  local_counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 == (long)this->nNew + (long)this->nTried) {
    this_01 = &(this->mapInfo)._M_h;
    p_Var16 = &(this->mapInfo)._M_h._M_before_begin;
    iVar18 = -8;
    while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
      n = *(nid_type *)(p_Var16 + 1);
      __k = (key_type *)(p_Var16 + 2);
      if (*(char *)&p_Var16[0x11]._M_nxt == '\x01') {
        if (p_Var16[0xf]._M_nxt == (_Hash_node_base *)0x0) {
          iVar18 = -1;
          goto LAB_0039c552;
        }
        if (*(int *)((long)&p_Var16[0x10]._M_nxt + 4) != 0) {
          iVar18 = -2;
          goto LAB_0039c552;
        }
        std::__detail::
        _Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&setTried,&n);
        CNetAddr::GetNetwork((CNetAddr *)__k);
        pmVar5 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_counts,(key_type *)&stack0xfffffffffffffe74);
        pmVar5->n_tried = pmVar5->n_tried + 1;
      }
      else {
        uVar4 = *(uint *)((long)&p_Var16[0x10]._M_nxt + 4);
        if (8 < uVar4) {
          iVar18 = -3;
          goto LAB_0039c552;
        }
        if (uVar4 == 0) {
          iVar18 = -4;
          goto LAB_0039c552;
        }
        puVar6 = (uint *)std::__detail::
                         _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&mapNew,&n);
        *puVar6 = uVar4;
        CNetAddr::GetNetwork((CNetAddr *)__k);
        pmVar5 = std::__detail::
                 _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_counts,(key_type *)&stack0xfffffffffffffe74);
        pmVar5->n_new = pmVar5->n_new + 1;
      }
      cVar7 = std::
              _Hashtable<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->mapAddr)._M_h,__k);
      if ((cVar7.super__Node_iterator_base<std::pair<const_CService,_long>,_false>._M_cur ==
           (__node_type *)0x0) ||
         (*(long *)((long)cVar7.super__Node_iterator_base<std::pair<const_CService,_long>,_false>.
                          _M_cur + 0x30) != n)) {
        iVar18 = -5;
        goto LAB_0039c552;
      }
      uVar12 = (ulong)*(int *)((long)&p_Var16[0x11]._M_nxt + 4);
      if ((((long)uVar12 < 0) ||
          (plVar2 = (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
          (ulong)((long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)plVar2 >> 3) <= uVar12)) ||
         (plVar2[uVar12] !=
          *(long *)((long)cVar7.super__Node_iterator_base<std::pair<const_CService,_long>,_false>.
                          _M_cur + 0x30))) {
        iVar18 = -0xe;
        goto LAB_0039c552;
      }
      if ((long)p_Var16[9]._M_nxt < 0) {
        iVar18 = -6;
        goto LAB_0039c552;
      }
      if ((long)p_Var16[0xf]._M_nxt < 0) goto LAB_0039c552;
    }
    if (setTried._M_h._M_element_count != (long)this->nTried) {
      iVar18 = -9;
      goto LAB_0039c552;
    }
    if (mapNew._M_h._M_element_count != (long)*fmt) {
      iVar18 = -10;
      goto LAB_0039c552;
    }
    panVar15 = this->vvTried;
    this_00 = &this->nKey;
    iVar18 = -0x12;
    for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
      panVar19 = panVar15;
      for (uVar14 = 0; uVar14 != 0x40; uVar14 = uVar14 + 1) {
        if ((*panVar15)[0] != -1) {
          sVar8 = std::
                  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::count(&setTried._M_h,*panVar15);
          if (sVar8 == 0) {
            iVar18 = -0xb;
          }
          else {
            cVar9 = std::
                    _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this_01,*panVar15);
            if (cVar9.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur !=
                (__node_type *)0x0) {
              uVar4 = AddrInfo::GetTriedBucket
                                ((AddrInfo *)
                                 ((long)cVar9.
                                        super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                        ._M_cur + 0x10),this_00,this->m_netgroupman);
              if (uVar12 == uVar4) {
                uVar4 = AddrInfo::GetBucketPosition
                                  ((AddrInfo *)
                                   ((long)cVar9.
                                          super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                          ._M_cur + 0x10),this_00,false,(int)uVar12);
                if (uVar14 == uVar4) {
                  std::
                  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::_M_erase(&setTried._M_h,panVar15);
                  goto LAB_0039c436;
                }
                goto LAB_0039c552;
              }
            }
            iVar18 = -0x11;
          }
          if (uVar12 < 0x100) goto LAB_0039c552;
          goto LAB_0039c49f;
        }
LAB_0039c436:
        panVar15 = (nid_type (*) [64])(*panVar15 + 1);
      }
      panVar15 = panVar19 + 1;
    }
LAB_0039c49f:
    panVar15 = this->vvNew;
    iVar18 = -0xc;
    for (lVar17 = 0; lVar17 != 0x400; lVar17 = lVar17 + 1) {
      panVar19 = panVar15;
      for (uVar12 = 0; uVar12 != 0x40; uVar12 = uVar12 + 1) {
        if ((*panVar15)[0] != -1) {
          sVar10 = std::
                   _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(&mapNew._M_h,*panVar15);
          if (sVar10 == 0) goto LAB_0039c552;
          cVar9 = std::
                  _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(this_01,*panVar15);
          if ((cVar9.super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>._M_cur ==
               (__node_type *)0x0) ||
             (uVar4 = AddrInfo::GetBucketPosition
                                ((AddrInfo *)
                                 ((long)cVar9.
                                        super__Node_iterator_base<std::pair<const_long,_AddrInfo>,_false>
                                        ._M_cur + 0x10),this_00,true,(int)lVar17), uVar12 != uVar4))
          {
            iVar18 = -0x13;
            goto LAB_0039c552;
          }
          pmVar11 = std::__detail::
                    _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&mapNew._M_h,*panVar15);
          *pmVar11 = *pmVar11 + -1;
          if (*pmVar11 == 0) {
            std::
            _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&mapNew._M_h,panVar15);
          }
        }
        panVar15 = (nid_type (*) [64])(*panVar15 + 1);
      }
      panVar15 = panVar19 + 1;
    }
    if (setTried._M_h._M_element_count == 0) {
      if (mapNew._M_h._M_element_count != 0) {
        iVar18 = -0xf;
        goto LAB_0039c552;
      }
      bVar3 = base_blob<256U>::IsNull(&this_00->super_base_blob<256U>);
      if (bVar3) {
        iVar18 = -0x10;
      }
      else if ((this->m_network_counts)._M_h._M_element_count < local_counts._M_h._M_element_count)
      {
        iVar18 = -0x14;
      }
      else {
        p_Var13 = &(this->m_network_counts)._M_h._M_before_begin;
        iVar18 = -0x15;
        while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
          pmVar5 = std::__detail::
                   _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_counts,(key_type *)(p_Var13 + 1));
          if (((_Hash_node_base *)pmVar5->n_new !=
               *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor) ||
             (pmVar5 = std::__detail::
                       _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_counts,(key_type *)(p_Var13 + 1)),
             (_Hash_node_base *)pmVar5->n_tried != p_Var13[3]._M_nxt)) goto LAB_0039c552;
        }
        iVar18 = 0;
      }
    }
    else {
      iVar18 = -0xd;
    }
  }
  else {
    iVar18 = -7;
  }
LAB_0039c552:
  std::
  _Hashtable<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_counts._M_h);
  std::
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&mapNew._M_h);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&setTried._M_h);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~Timer(&logging_timer2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar18;
}

Assistant:

int AddrManImpl::CheckAddrman() const
{
    AssertLockHeld(cs);

    LOG_TIME_MILLIS_WITH_CATEGORY_MSG_ONCE(
        strprintf("new %i, tried %i, total %u", nNew, nTried, vRandom.size()), BCLog::ADDRMAN);

    std::unordered_set<nid_type> setTried;
    std::unordered_map<nid_type, int> mapNew;
    std::unordered_map<Network, NewTriedCount> local_counts;

    if (vRandom.size() != (size_t)(nTried + nNew))
        return -7;

    for (const auto& entry : mapInfo) {
        nid_type n = entry.first;
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            if (!TicksSinceEpoch<std::chrono::seconds>(info.m_last_success)) {
                return -1;
            }
            if (info.nRefCount)
                return -2;
            setTried.insert(n);
            local_counts[info.GetNetwork()].n_tried++;
        } else {
            if (info.nRefCount < 0 || info.nRefCount > ADDRMAN_NEW_BUCKETS_PER_ADDRESS)
                return -3;
            if (!info.nRefCount)
                return -4;
            mapNew[n] = info.nRefCount;
            local_counts[info.GetNetwork()].n_new++;
        }
        const auto it{mapAddr.find(info)};
        if (it == mapAddr.end() || it->second != n) {
            return -5;
        }
        if (info.nRandomPos < 0 || (size_t)info.nRandomPos >= vRandom.size() || vRandom[info.nRandomPos] != n)
            return -14;
        if (info.m_last_try < NodeSeconds{0s}) {
            return -6;
        }
        if (info.m_last_success < NodeSeconds{0s}) {
            return -8;
        }
    }

    if (setTried.size() != (size_t)nTried)
        return -9;
    if (mapNew.size() != (size_t)nNew)
        return -10;

    for (int n = 0; n < ADDRMAN_TRIED_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvTried[n][i] != -1) {
                if (!setTried.count(vvTried[n][i]))
                    return -11;
                const auto it{mapInfo.find(vvTried[n][i])};
                if (it == mapInfo.end() || it->second.GetTriedBucket(nKey, m_netgroupman) != n) {
                    return -17;
                }
                if (it->second.GetBucketPosition(nKey, false, n) != i) {
                    return -18;
                }
                setTried.erase(vvTried[n][i]);
            }
        }
    }

    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; n++) {
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[n][i] != -1) {
                if (!mapNew.count(vvNew[n][i]))
                    return -12;
                const auto it{mapInfo.find(vvNew[n][i])};
                if (it == mapInfo.end() || it->second.GetBucketPosition(nKey, true, n) != i) {
                    return -19;
                }
                if (--mapNew[vvNew[n][i]] == 0)
                    mapNew.erase(vvNew[n][i]);
            }
        }
    }

    if (setTried.size())
        return -13;
    if (mapNew.size())
        return -15;
    if (nKey.IsNull())
        return -16;

    // It's possible that m_network_counts may have all-zero entries that local_counts
    // doesn't have if addrs from a network were being added and then removed again in the past.
    if (m_network_counts.size() < local_counts.size()) {
        return -20;
    }
    for (const auto& [net, count] : m_network_counts) {
        if (local_counts[net].n_new != count.n_new || local_counts[net].n_tried != count.n_tried) {
            return -21;
        }
    }

    return 0;
}